

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QDialogButtonBox::StandardButton>::
emplace_back_impl<QDialogButtonBox::StandardButton_const&>
          (QVLABase<QDialogButtonBox::StandardButton> *this,qsizetype prealloc,void *array,
          StandardButton *args)

{
  QVLABase<QDialogButtonBox::StandardButton> *this_00;
  QVLABase<QDialogButtonBox::StandardButton> *pQVar1;
  iterator ptr;
  StandardButton *pSVar2;
  StandardButton *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QDialogButtonBox::StandardButton> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QDialogButtonBox::StandardButton> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QDialogButtonBox::StandardButton> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pSVar2 = q20::
           construct_at<QDialogButtonBox::StandardButton,QDialogButtonBox::StandardButton_const&,void>
                     (ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pSVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }